

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.h
# Opt level: O0

void __thiscall Am_Assoc_Data::Am_Assoc_Data(Am_Assoc_Data *this,Am_Value *val1,Am_Value *val2)

{
  Am_Value *val2_local;
  Am_Value *val1_local;
  Am_Assoc_Data *this_local;
  
  Am_Wrapper::Am_Wrapper(&this->super_Am_Wrapper);
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_00411130;
  Am_Value::Am_Value(&this->value_1);
  Am_Value::Am_Value(&this->value_2);
  Am_Value::operator=(&this->value_1,val1);
  Am_Value::operator=(&this->value_2,val2);
  return;
}

Assistant:

Am_Assoc_Data(const Am_Value &val1, const Am_Value &val2)
  {
    value_1 = val1;
    value_2 = val2;
  }